

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::ltSI32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Literal *other_local;
  Literal *this_local;
  
  compare<4,_&wasm::Literal::getLanesI32x4,_&wasm::Literal::ltS,_int>
            (__return_storage_ptr__,this,other);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::ltSI32x4(const Literal& other) const {
  return compare<4, &Literal::getLanesI32x4, &Literal::ltS>(*this, other);
}